

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ea1bc::FunctionRegistrator::FunctionRegistrator(FunctionRegistrator *this)

{
  std::
  map<std::pair<double,_double>_(*)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<double,_double>_(*)()>,_std::allocator<std::pair<std::pair<double,_double>_(*const)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::pair<double,_double>_(*)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<double,_double>_(*)()>,_std::allocator<std::pair<std::pair<double,_double>_(*const)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x179fce);
  return;
}

Assistant:

FunctionRegistrator()
        {
            table.AbsoluteDifference = &Image_Function_Simd::AbsoluteDifference;
            table.Accumulate         = &Image_Function_Simd::Accumulate;
            table.BitwiseAnd         = &Image_Function_Simd::BitwiseAnd;
            table.BitwiseOr          = &Image_Function_Simd::BitwiseOr;
            table.BitwiseXor         = &Image_Function_Simd::BitwiseXor;
            table.ConvertToRgb       = &Image_Function_Simd::ConvertToRgb;
            table.Flip               = &Image_Function_Simd::Flip;
            table.Invert             = &Image_Function_Simd::Invert;
            table.Maximum            = &Image_Function_Simd::Maximum;
            table.Minimum            = &Image_Function_Simd::Minimum;
            table.ProjectionProfile  = &Image_Function_Simd::ProjectionProfile;
            table.RgbToBgr           = &Image_Function_Simd::RgbToBgr;
            table.Subtract           = &Image_Function_Simd::Subtract;
            table.Sum                = &Image_Function_Simd::Sum;
            table.Threshold          = &Image_Function_Simd::Threshold;
            table.Threshold2         = &Image_Function_Simd::Threshold;

            ImageTypeManager::instance().setFunctionTable( PenguinV_Image::Image().type(), table, true );
        }